

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  char *in_RDI;
  
  luaL_register(L,in_RDI,(luaL_Reg *)0x10f6ac);
  createmetatable((lua_State *)0x10f6b5);
  return 1;
}

Assistant:

static int luaopen_string(lua_State*L){
luaL_register(L,"string",strlib);
createmetatable(L);
return 1;
}